

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phyr_math.h
# Opt level: O2

bool __thiscall phyr::_Mat4x4::operator==(_Mat4x4 *this,Mat4x4 *m)

{
  double *pdVar1;
  double dVar2;
  int i;
  ulong uVar3;
  int j;
  long lVar4;
  
  for (uVar3 = 0; uVar3 != 4; uVar3 = uVar3 + 1) {
    lVar4 = 0;
    while (lVar4 != 4) {
      dVar2 = (*(double (*) [4])*(double (*) [4])this)[lVar4];
      pdVar1 = *(double (*) [4])*(double (*) [4])m + lVar4;
      lVar4 = lVar4 + 1;
      if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) goto LAB_001014bd;
    }
    this = (_Mat4x4 *)((long)this + 0x20);
    m = (Mat4x4 *)((long)m + 0x20);
  }
LAB_001014bd:
  return 3 < uVar3;
}

Assistant:

bool operator==(const Mat4x4& m) const {
        for (int i = 0; i < 4; i++)
            for (int j = 0; j < 4; j++)
                if (d[i][j] != m.d[i][j]) return false;
        return true;
    }